

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O2

string * google::protobuf::util::converter::ValueAsString<int>
                   (string *__return_storage_ptr__,int value)

{
  AlphaNum *a;
  AlphaNum local_48;
  
  strings::AlphaNum::AlphaNum(&local_48,value);
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_48,a);
  return __return_storage_ptr__;
}

Assistant:

std::string ValueAsString(T value) {
  return StrCat(value);
}